

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutOracle.c
# Opt level: O0

Cut_Cut_t * Cut_CutMerge(Cut_Oracle_t *p,Cut_Cut_t *pCut0,Cut_Cut_t *pCut1)

{
  int iVar1;
  Cut_Cut_t *pCVar2;
  int local_40;
  uint local_3c;
  int c;
  int k;
  int i;
  int Limit;
  Cut_Cut_t *pCut;
  Cut_Cut_t *pCut1_local;
  Cut_Cut_t *pCut0_local;
  Cut_Oracle_t *p_local;
  
  pCVar2 = Cut_CutStart(p);
  iVar1 = p->pParams->nVarsMax;
  local_3c = 0;
  c = 0;
  for (local_40 = 0; local_40 < iVar1; local_40 = local_40 + 1) {
    if (local_3c == *(uint *)pCut1 >> 0x1c) {
      if (c == *(uint *)pCut0 >> 0x1c) {
        *(uint *)pCVar2 = *(uint *)pCVar2 & 0xfffffff | local_40 << 0x1c;
        return pCVar2;
      }
      *(undefined4 *)(&pCVar2[1].field_0x0 + (long)local_40 * 4) =
           *(undefined4 *)(&pCut0[1].field_0x0 + (long)c * 4);
      c = c + 1;
    }
    else if (c == *(uint *)pCut0 >> 0x1c) {
      if (local_3c == *(uint *)pCut1 >> 0x1c) {
        *(uint *)pCVar2 = *(uint *)pCVar2 & 0xfffffff | local_40 << 0x1c;
        return pCVar2;
      }
      *(undefined4 *)(&pCVar2[1].field_0x0 + (long)local_40 * 4) =
           *(undefined4 *)(&pCut1[1].field_0x0 + (long)(int)local_3c * 4);
      local_3c = local_3c + 1;
    }
    else if (*(int *)(&pCut0[1].field_0x0 + (long)c * 4) <
             *(int *)(&pCut1[1].field_0x0 + (long)(int)local_3c * 4)) {
      *(undefined4 *)(&pCVar2[1].field_0x0 + (long)local_40 * 4) =
           *(undefined4 *)(&pCut0[1].field_0x0 + (long)c * 4);
      c = c + 1;
    }
    else if (*(int *)(&pCut1[1].field_0x0 + (long)(int)local_3c * 4) <
             *(int *)(&pCut0[1].field_0x0 + (long)c * 4)) {
      *(undefined4 *)(&pCVar2[1].field_0x0 + (long)local_40 * 4) =
           *(undefined4 *)(&pCut1[1].field_0x0 + (long)(int)local_3c * 4);
      local_3c = local_3c + 1;
    }
    else {
      *(undefined4 *)(&pCVar2[1].field_0x0 + (long)local_40 * 4) =
           *(undefined4 *)(&pCut0[1].field_0x0 + (long)c * 4);
      local_3c = local_3c + 1;
      c = c + 1;
    }
  }
  if ((c == *(uint *)pCut0 >> 0x1c) && (local_3c == *(uint *)pCut1 >> 0x1c)) {
    *(uint *)pCVar2 = *(uint *)pCVar2 & 0xfffffff | local_40 << 0x1c;
    return pCVar2;
  }
  __assert_fail("i == (int)pCut0->nLeaves && k == (int)pCut1->nLeaves",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cut/cutOracle.c"
                ,0x130,"Cut_Cut_t *Cut_CutMerge(Cut_Oracle_t *, Cut_Cut_t *, Cut_Cut_t *)");
}

Assistant:

Cut_Cut_t * Cut_CutMerge( Cut_Oracle_t * p, Cut_Cut_t * pCut0, Cut_Cut_t * pCut1 )
{
    Cut_Cut_t * pCut;
    int Limit, i, k, c;
    // create the leaves of the new cut
    pCut = Cut_CutStart( p );
    Limit = p->pParams->nVarsMax;
    for ( i = k = c = 0; c < Limit; c++ )
    {
        if ( k == (int)pCut1->nLeaves )
        {
            if ( i == (int)pCut0->nLeaves )
            {
                pCut->nLeaves = c;
                return pCut;
            }
            pCut->pLeaves[c] = pCut0->pLeaves[i++];
            continue;
        }
        if ( i == (int)pCut0->nLeaves )
        {
            if ( k == (int)pCut1->nLeaves )
            {
                pCut->nLeaves = c;
                return pCut;
            }
            pCut->pLeaves[c] = pCut1->pLeaves[k++];
            continue;
        }
        if ( pCut0->pLeaves[i] < pCut1->pLeaves[k] )
        {
            pCut->pLeaves[c] = pCut0->pLeaves[i++];
            continue;
        }
        if ( pCut0->pLeaves[i] > pCut1->pLeaves[k] )
        {
            pCut->pLeaves[c] = pCut1->pLeaves[k++];
            continue;
        }
        pCut->pLeaves[c] = pCut0->pLeaves[i++]; 
        k++;
    }
    assert( i == (int)pCut0->nLeaves && k == (int)pCut1->nLeaves );
    pCut->nLeaves = c;
    return pCut;
}